

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcSetLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,int iLit)

{
  int i;
  int *piVar1;
  Vec_Int_t *p_00;
  
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    piVar1 = Saig_ManBmcMapping(p,pObj);
    if (piVar1 == (int *)0x0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x366,"int Saig_ManBmcSetLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int, int)");
    }
  }
  i = Vec_IntEntry(p->vId2Num,pObj->Id);
  p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vId2Var,iFrame);
  Vec_IntWriteEntry(p_00,i,iLit);
  return iLit;
}

Assistant:

static inline int Saig_ManBmcSetLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, int iLit )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    Vec_IntWriteEntry( vFrame, ObjNum, iLit );
/*
    if ( Vec_IntEntry( p->vMapRefs, Aig_ObjId(pObj) ) > 1 )
        p->nLitUsed++;
    else
        p->nLitUseless++;
*/
    return iLit;
}